

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

int u8_to_hex(uint8_t *in,int in_len,uint8_t *out)

{
  int i;
  uint8_t *out_local;
  int in_len_local;
  uint8_t *in_local;
  int local_4;
  
  if ((in == (uint8_t *)0x0) || (out == (uint8_t *)0x0)) {
    local_4 = 0;
  }
  else {
    out_local = out;
    for (i = 0; i < in_len; i = i + 1) {
      *out_local = "0123456789abcdef"[(int)(uint)in[i] >> 4];
      out_local[1] = "0123456789abcdef"[(int)(in[i] & 0xf)];
      out_local = out_local + 2;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int u8_to_hex(const uint8_t *in, int in_len, uint8_t *out)
{
    if (in == NULL || out == NULL)
        return GML_ERROR;

    for (int i = 0; i < in_len; i++) {
        out[0] = ascii_table[in[i] >> 4];
        out[1] = ascii_table[in[i] & 0xf];
        out += 2;
    }
    return GML_OK;
}